

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O1

void __thiscall DBaseStatusBar::DrawMessages(DBaseStatusBar *this,int layer,int bottom)

{
  uint uVar1;
  uint uVar2;
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 this_00;
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 aVar3;
  
  this_00 = (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)this->Messages[layer].field_0.p;
  if ((this_00.p != (DHUDMessage *)0x0) && ((((this_00.p)->super_DObject).ObjectFlags & 0x20) != 0))
  {
    this->Messages[layer].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)0x0;
    this_00.p = (DHUDMessage *)0x0;
  }
  uVar2 = 0;
  if (automapactive != false) {
    uVar2 = viewactive + 2 + (uint)viewactive;
  }
  if (this_00.p != (DHUDMessage *)0x0) {
    uVar1 = (uint)viewactive;
    do {
      aVar3 = (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)((this_00.p)->Next).field_0.p;
      if ((aVar3.p != (DHUDMessage *)0x0) && ((((aVar3.p)->super_DObject).ObjectFlags & 0x20) != 0))
      {
        ((this_00.p)->Next).field_0.p = (DHUDMessage *)0x0;
        aVar3.p = (DHUDMessage *)0x0;
      }
      DHUDMessage::Draw(this_00.p,bottom,uVar2 | uVar1);
      this_00 = aVar3;
    } while (aVar3.p != (DHUDMessage *)0x0);
  }
  return;
}

Assistant:

void DBaseStatusBar::DrawMessages (int layer, int bottom)
{
	DHUDMessage *msg = Messages[layer];
	int visibility = 0;

	if (viewactive)
	{
		visibility |= HUDMSG_NotWith3DView;
	}
	if (automapactive)
	{
		visibility |= viewactive ? HUDMSG_NotWithOverlayMap : HUDMSG_NotWithFullMap;
	}
	while (msg)
	{
		DHUDMessage *next = msg->Next;
		msg->Draw (bottom, visibility);
		msg = next;
	}
}